

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Function.h
# Opt level: O2

void slang::
     function_ref<void(char,unsigned_long,unsigned_long,slang::ast::SFormat::FormatOptions_const&)>
     ::
     callback_fn<slang::ast::FmtHelpers::formatArgs[abi:cxx11](std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation,slang::ast::Scope_const&,slang::ast::EvalContext&,std::span<slang::ast::Expression_const*const,18446744073709551615ul>const&,bool)::__1>
               (intptr_t callable,char params,unsigned_long params_1,unsigned_long params_2,
               FormatOptions *params_3)

{
  undefined8 *puVar1;
  Expression *this;
  EvalContext *this_00;
  Type *pTVar2;
  string *result;
  bool bVar3;
  char cVar4;
  bitwidth_t bVar5;
  Diagnostic *pDVar6;
  SourceRange range;
  _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  local_58;
  
  bVar3 = ast::formatSpecialArg(params,*(Scope **)callable,*(string **)(callable + 8));
  if (bVar3) {
    return;
  }
  range = ast::FmtHelpers::formatArgs::anon_class_16_2_839514d5::operator()
                    (*(anon_class_16_2_839514d5 **)(callable + 0x10),params_1,params_2);
  puVar1 = (undefined8 *)**(long **)(callable + 0x18);
  if (puVar1 == (undefined8 *)((*(long **)(callable + 0x20))[1] * 8 + **(long **)(callable + 0x20)))
  {
    pDVar6 = ast::EvalContext::addDiag(*(EvalContext **)(callable + 0x28),(DiagCode)0x12000b,range);
    Diagnostic::operator<<(pDVar6,params);
    goto LAB_0029ccae;
  }
  **(long **)(callable + 0x18) = (long)(puVar1 + 1);
  this = (Expression *)*puVar1;
  this_00 = *(EvalContext **)(callable + 0x28);
  if (this->kind == EmptyArgument) {
    pDVar6 = ast::EvalContext::addDiag(this_00,(DiagCode)0x10000b,this->sourceRange);
    goto LAB_0029cc66;
  }
  bVar3 = ast::Expression::bad(this);
  if (bVar3) goto LAB_0029ccae;
  pTVar2 = (this->type).ptr;
  cVar4 = charToLower(params);
  switch(cVar4) {
  case 'b':
  case 'c':
  case 'd':
  case 'h':
  case 'o':
  case 'x':
    bVar3 = ast::Type::isIntegral(pTVar2);
    if ((bVar3) || (bVar3 = ast::Type::isString(pTVar2), bVar3)) goto LAB_0029cdea;
    bVar3 = ast::Type::isFloating(pTVar2);
    if (bVar3) {
      pDVar6 = ast::EvalContext::addDiag(this_00,(DiagCode)0x2d000b,this->sourceRange);
      pDVar6 = Diagnostic::operator<<(pDVar6,params);
      goto LAB_0029cdcd;
    }
    break;
  case 'e':
  case 'f':
  case 'g':
  case 't':
    bVar3 = ast::Type::isNumeric(pTVar2);
    goto LAB_0029cd6a;
  case 'p':
    bVar3 = ast::Type::isVoid(pTVar2);
    if (!bVar3) goto LAB_0029cdea;
    break;
  case 's':
    bVar3 = ast::Type::canBeStringLike(pTVar2);
    goto LAB_0029cd6a;
  case 'u':
  case 'z':
    bVar3 = ast::isValidForRaw(pTVar2);
LAB_0029cd6a:
    if (bVar3 != false) {
LAB_0029cdea:
      ast::Expression::eval((ConstantValue *)&local_58,this,*(EvalContext **)(callable + 0x28));
      if (local_58._M_index == '\0') {
        **(undefined1 **)(callable + 0x30) = 0;
      }
      else {
        result = *(string **)(callable + 8);
        pTVar2 = (this->type).ptr;
        bVar3 = ast::Expression::isImplicitString(this);
        ast::SFormat::formatArg(result,(ConstantValue *)&local_58,pTVar2,params,params_3,bVar3);
      }
      std::__detail::__variant::
      _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
      ::~_Variant_storage(&local_58);
      return;
    }
    break;
  case 'v':
    bVar3 = ast::Type::isIntegral(pTVar2);
    if (bVar3) {
      bVar5 = ast::Type::getBitWidth(pTVar2);
      if (bVar5 < 2) goto LAB_0029cdea;
      pDVar6 = ast::EvalContext::addDiag(this_00,(DiagCode)0x2c000b,this->sourceRange);
LAB_0029cdcd:
      Diagnostic::operator<<(pDVar6,range);
      goto LAB_0029cdea;
    }
  }
  pDVar6 = ast::EvalContext::addDiag(this_00,(DiagCode)0x11000b,this->sourceRange);
  pDVar6 = ast::operator<<(pDVar6,pTVar2);
LAB_0029cc66:
  pDVar6 = Diagnostic::operator<<(pDVar6,params);
  Diagnostic::operator<<(pDVar6,range);
LAB_0029ccae:
  **(undefined1 **)(callable + 0x30) = 0;
  return;
}

Assistant:

static Ret callback_fn(intptr_t callable, Params... params) {
        return (*reinterpret_cast<Callable*>(callable))(std::forward<Params>(params)...);
    }